

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::truncSatZeroUToI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  bool bVar1;
  bool bVar2;
  long lVar3;
  Literal *pLVar4;
  Literal *this_00;
  undefined1 auStack_e8 [8];
  LaneArray<4> result;
  undefined1 local_80 [8];
  LaneArray<4___2> lanes;
  
  pLVar4 = (Literal *)local_80;
  getLanesF64x2((LaneArray<2> *)pLVar4,this);
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  auStack_e8 = (undefined1  [8])0x0;
  result._M_elems[0].field_0.i64 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[1].type;
  this_00 = (Literal *)auStack_e8;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    truncSatToUI32((Literal *)__return_storage_ptr___00,pLVar4);
    ~Literal(this_00);
    Literal(this_00,(Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)__return_storage_ptr___00);
    pLVar4 = (Literal *)&lanes._M_elems[0].type;
    this_00 = (Literal *)&result._M_elems[0].type;
    bVar1 = false;
  } while (bVar2);
  lVar3 = 0x30;
  do {
    makeZero((Literal *)__return_storage_ptr___00,
             (Type)lanes._M_elems[0].field_0.gcData.
                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    pLVar4 = (Literal *)((long)result._M_elems + lVar3 + -8);
    if (pLVar4 != (Literal *)__return_storage_ptr___00) {
      ~Literal(pLVar4);
      Literal(pLVar4,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)auStack_e8);
  lVar3 = 0x48;
  do {
    ~Literal((Literal *)((long)result._M_elems + lVar3 + -8));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_80 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatZeroUToI32x4() const {
  return unary_zero<4, &Literal::getLanesF64x2, &Literal::truncSatToUI32>(
    *this);
}